

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall
FIX::UtcTimeStampField::UtcTimeStampField
          (UtcTimeStampField *this,int field,UtcTimeStamp *data,int precision)

{
  string sStack_38;
  
  UtcTimeStampConvertor::convert_abi_cxx11_
            (&sStack_38,(UtcTimeStampConvertor *)data,(UtcTimeStamp *)(ulong)(uint)precision,
             precision);
  FieldBase::FieldBase(&this->super_FieldBase,field,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011b6c8;
  return;
}

Assistant:

explicit UtcTimeStampField(int field, const UtcTimeStamp &data, int precision = 0)
      : FieldBase(field, UtcTimeStampConvertor::convert(data, precision)) {}